

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallTargetGenerator::GenerateScriptForConfig
          (cmInstallTargetGenerator *this,ostream *os,string *config,Indent indent)

{
  bool bVar1;
  bool bVar2;
  long *plVar3;
  cmInstallTargetGenerator *pcVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string literal_args;
  string toDir;
  string dest;
  Files files;
  string local_170;
  _Any_data local_150;
  _Manager_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  element_type *local_130;
  pointer local_128;
  _Any_data local_120;
  undefined1 local_110 [32];
  undefined1 local_f0 [32];
  string local_d0;
  Files local_b0;
  
  GetFiles(&local_b0,this,config);
  if (local_b0.From.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b0.From.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    GetDestination(&local_d0,this,config);
    if ((element_type *)local_b0.ToDir._M_string_length != (element_type *)0x0) {
      local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110;
      local_120._M_unused._M_member_pointer = 1;
      local_110[0] = 0x2f;
      local_150._M_unused._M_object = (void *)local_d0._M_string_length;
      local_150._8_8_ = local_d0._M_dataplus._M_p;
      local_140 = (_Manager_type)0x1;
      local_130 = (element_type *)local_b0.ToDir._M_string_length;
      local_128 = local_b0.ToDir._M_dataplus._M_p;
      views._M_len = 3;
      views._M_array = (iterator)&local_150;
      local_120._8_8_ = local_138;
      cmCatViews_abi_cxx11_((string *)(local_110 + 0x20),views);
      std::__cxx11::string::operator=((string *)&local_d0,(string *)(local_110 + 0x20));
      if ((undefined1 *)local_f0._0_8_ != local_110 + 0x30) {
        operator_delete((void *)local_f0._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_f0._16_8_)->_M_p + 1));
      }
    }
    cmInstallGenerator::ConvertToAbsoluteDestination(&local_170,&local_d0);
    local_150._M_unused._M_member_pointer = 1;
    local_140 = (_Manager_type)CONCAT71(local_140._1_7_,0x2f);
    local_120._M_unused._M_object = (void *)local_170._M_string_length;
    local_120._8_8_ = local_170._M_dataplus._M_p;
    local_110._0_8_ = (_func_int **)0x1;
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_120;
    local_150._8_8_ = &local_140;
    local_110._8_8_ = &local_140;
    cmCatViews_abi_cxx11_((string *)(local_110 + 0x20),views_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if (local_b0.NoTweak == false) {
      local_150._8_8_ = 0;
      local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)std::
                     _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_&,_cmScriptGeneratorIndent,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallTargetGenerator.cxx:86:14)>
                     ::_M_invoke;
      local_140 = std::
                  _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_&,_cmScriptGeneratorIndent,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallTargetGenerator.cxx:86:14)>
                  ::_M_manager;
      local_150._M_unused._M_object = this;
      cmInstallGenerator::AddTweak
                (os,indent,config,(string *)(local_110 + 0x20),&local_b0.To,
                 (TweakMethod *)&local_150);
      if (local_140 != (_Manager_type)0x0) {
        (*local_140)(&local_150,&local_150,__destroy_functor);
      }
    }
    bVar1 = this->ImportLibrary;
    bVar2 = this->Optional;
    local_150._8_8_ = (pointer)0x0;
    local_140 = (_Manager_type)((ulong)local_140 & 0xffffffffffffff00);
    local_150._M_unused._M_object = &local_140;
    if (local_b0.FromDir._M_string_length != 0) {
      std::operator+(&local_170," FILES_FROM_DIR \"",&local_b0.FromDir);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_170);
      pcVar4 = (cmInstallTargetGenerator *)(plVar3 + 2);
      if ((cmInstallTargetGenerator *)*plVar3 == pcVar4) {
        local_110._0_8_ =
             (pcVar4->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator;
        local_110._8_8_ = plVar3[3];
        local_120._M_unused._M_object = (cmInstallTargetGenerator *)local_110;
      }
      else {
        local_110._0_8_ =
             (pcVar4->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator;
        local_120._M_unused._M_object = (cmInstallTargetGenerator *)*plVar3;
      }
      local_120._8_8_ = plVar3[1];
      *plVar3 = (long)pcVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append(local_150._M_pod_data,local_120._M_unused._M_member_pointer);
      if ((cmInstallTargetGenerator *)local_120._M_unused._0_8_ !=
          (cmInstallTargetGenerator *)local_110) {
        operator_delete(local_120._M_unused._M_object,local_110._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_b0.UseSourcePermissions == true) {
      std::__cxx11::string::append(local_150._M_pod_data);
    }
    cmInstallGenerator::AddInstallRule
              (&this->super_cmInstallGenerator,os,&local_d0,local_b0.Type,&local_b0.From,
               (bool)((bVar1 | bVar2) & 1),(this->FilePermissions)._M_dataplus._M_p,(char *)0x0,
               (char *)0x0,(char *)local_150._M_unused._0_8_,indent,(char *)0x0);
    if (local_b0.NoTweak == false) {
      local_120._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_110._8_8_ =
           std::
           _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_&,_cmScriptGeneratorIndent,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallTargetGenerator.cxx:110:14)>
           ::_M_invoke;
      local_110._0_8_ =
           std::
           _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_&,_cmScriptGeneratorIndent,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallTargetGenerator.cxx:110:14)>
           ::_M_manager;
      local_120._M_unused._M_object = this;
      cmInstallGenerator::AddTweak
                (os,indent,config,(string *)(local_110 + 0x20),&local_b0.To,
                 (TweakMethod *)&local_120);
      if ((_func_int **)local_110._0_8_ != (_func_int **)0x0) {
        (*(code *)local_110._0_8_)(&local_120,&local_120,3);
      }
    }
    if ((_Manager_type *)local_150._M_unused._0_8_ != &local_140) {
      operator_delete(local_150._M_unused._M_object,(ulong)(local_140 + 1));
    }
    if ((undefined1 *)local_f0._0_8_ != local_110 + 0x30) {
      operator_delete((void *)local_f0._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_f0._16_8_)->_M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.ToDir._M_dataplus._M_p != &local_b0.ToDir.field_2) {
    operator_delete(local_b0.ToDir._M_dataplus._M_p,local_b0.ToDir.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.FromDir._M_dataplus._M_p != &local_b0.FromDir.field_2) {
    operator_delete(local_b0.FromDir._M_dataplus._M_p,
                    local_b0.FromDir.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.To);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.From);
  return;
}

Assistant:

void cmInstallTargetGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  // Compute the list of files to install for this target.
  Files files = this->GetFiles(config);

  // Skip this rule if no files are to be installed for the target.
  if (files.From.empty()) {
    return;
  }

  // Compute the effective install destination.
  std::string dest = this->GetDestination(config);
  if (!files.ToDir.empty()) {
    dest = cmStrCat(dest, '/', files.ToDir);
  }

  // Tweak files located in the destination directory.
  std::string toDir = cmStrCat(ConvertToAbsoluteDestination(dest), '/');

  // Add pre-installation tweaks.
  if (!files.NoTweak) {
    AddTweak(os, indent, config, toDir, files.To,
             [this](std::ostream& o, Indent i, const std::string& c,
                    const std::string& f) {
               this->PreReplacementTweaks(o, i, c, f);
             });
  }

  // Write code to install the target file.
  const char* no_dir_permissions = nullptr;
  const char* no_rename = nullptr;
  bool optional = this->Optional || this->ImportLibrary;
  std::string literal_args;
  if (!files.FromDir.empty()) {
    literal_args += " FILES_FROM_DIR \"" + files.FromDir + "\"";
  }
  if (files.UseSourcePermissions) {
    literal_args += " USE_SOURCE_PERMISSIONS";
  }
  this->AddInstallRule(os, dest, files.Type, files.From, optional,
                       this->FilePermissions.c_str(), no_dir_permissions,
                       no_rename, literal_args.c_str(), indent);

  // Add post-installation tweaks.
  if (!files.NoTweak) {
    AddTweak(os, indent, config, toDir, files.To,
             [this](std::ostream& o, Indent i, const std::string& c,
                    const std::string& f) {
               this->PostReplacementTweaks(o, i, c, f);
             });
  }
}